

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O0

int av1_check_trailing_bits(AV1Decoder *pbi,aom_read_bit_buffer *rb)

{
  int iVar1;
  int iVar2;
  long in_RSI;
  long in_RDI;
  int trailing;
  int bits_before_alignment;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 local_4;
  
  iVar1 = 8 - (*(uint *)(in_RSI + 0x10) & 7);
  iVar2 = aom_rb_read_literal((aom_read_bit_buffer *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),
                              in_stack_ffffffffffffffdc);
  if (iVar2 == 1 << ((char)iVar1 - 1U & 0x1f)) {
    local_4 = 0;
  }
  else {
    *(undefined4 *)(in_RDI + 0x5ff08) = 7;
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int av1_check_trailing_bits(AV1Decoder *pbi, struct aom_read_bit_buffer *rb) {
  // bit_offset is set to 0 (mod 8) when the reader is already byte aligned
  int bits_before_alignment = 8 - rb->bit_offset % 8;
  int trailing = aom_rb_read_literal(rb, bits_before_alignment);
  if (trailing != (1 << (bits_before_alignment - 1))) {
    pbi->error.error_code = AOM_CODEC_CORRUPT_FRAME;
    return -1;
  }
  return 0;
}